

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O3

uint32_t Ngram_bow(Ngram model,uint32_t *gram_words,uint32_t gram_len)

{
  uint uVar1;
  LowGram_T *pLVar2;
  ulong uVar3;
  long lVar4;
  UniGram_T *pUVar5;
  int iVar6;
  uint uVar7;
  uint32_t *puVar8;
  UniGram_T *pUVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  pUVar9 = model->uni_gram + *gram_words;
  if (gram_len == 1) {
    puVar8 = &pUVar9->bow;
  }
  else {
    if (model->ngram_order <= gram_len) {
      return 0;
    }
    if (gram_len != 0) {
      pUVar5 = model->uni_gram + (*gram_words + 1);
      uVar3 = 1;
      lVar4 = 0;
      do {
        uVar7 = pUVar9->next_arr_idx;
        pLVar2 = model->low_grams[lVar4];
        iVar6 = -1;
        uVar10 = pUVar5->next_arr_idx - uVar7;
        if (uVar10 != 0) {
          uVar1 = gram_words[uVar3];
          lVar11 = (ulong)uVar10 - 1;
          lVar13 = 0;
          do {
            uVar12 = (ulong)(lVar13 + lVar11) >> 1;
            uVar10 = pLVar2[uVar7 + uVar12].word;
            if (uVar10 == uVar1) {
              iVar6 = (int)uVar12;
              break;
            }
            if (uVar10 < uVar1 || uVar10 == uVar1) {
              lVar13 = uVar12 + 1;
            }
            else {
              lVar11 = uVar12 - 1;
            }
          } while (lVar13 <= lVar11);
        }
        uVar7 = iVar6 + uVar7;
        if (uVar3 == gram_len - 1) {
          puVar8 = &pLVar2[uVar7].bow;
          goto LAB_001034a1;
        }
        if (uVar7 == 0xffffffff) {
          return 0xffffffff;
        }
        pUVar9 = (UniGram_T *)&pLVar2[uVar7].next_arr_idx;
        pUVar5 = (UniGram_T *)&pLVar2[(ulong)uVar7 + 1].next_arr_idx;
        lVar4 = lVar4 + 1;
        uVar3 = uVar3 + 1;
      } while( true );
    }
    puVar8 = &(*model->low_grams)[0xffffffff].bow;
  }
LAB_001034a1:
  return *puVar8;
}

Assistant:

uint32_t Ngram_bow(const Ngram model, const uint32_t* gram_words, uint32_t gram_len){
    uint32_t cur_word_id = gram_words[0];
    uint32_t next_word_start = model->uni_gram[cur_word_id].next_arr_idx;
    uint32_t next_word_end = model->uni_gram[cur_word_id+1].next_arr_idx;
    if (gram_len == 1) {
        return model->uni_gram[cur_word_id].bow;
    }
    if (gram_len >= model->ngram_order) {
        return 0;
    }
    uint32_t next = -1;
    uint32_t ngram_idx = 0;
    for (uint32_t j = 1; j < gram_len;j++) {
        next = search_low_gram(gram_words[j], model->low_grams[ngram_idx] + next_word_start, next_word_end - next_word_start)+next_word_start; 
        if(j == gram_len -1){
           return model->low_grams[ngram_idx][next].bow;
        }
        if (next == -1) {
            return -1;
        }else{
            next_word_start = model->low_grams[ngram_idx][next].next_arr_idx;
            next_word_end = model->low_grams[ngram_idx][next+1].next_arr_idx;
        }
        ngram_idx+=1;
    }
    return model->low_grams[ngram_idx][next].bow;
}